

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polytri-cli.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  vertex_t *pvVar1;
  pointer ptVar2;
  size_t sVar3;
  istream *piVar4;
  ostream *poVar5;
  int iVar6;
  triangle_t *t;
  pointer ptVar7;
  uint cid;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint npoints;
  uint ncontours;
  vector<vector_t,_std::allocator<vector_t>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> contour_lengths;
  TriangleBuffer_t triangles;
  ifstream fd;
  uint local_2a0;
  uint local_29c;
  vertex_t *local_298;
  iterator iStack_290;
  vector_t *local_288;
  uint32_t *local_278;
  iterator iStack_270;
  uint *local_268;
  TriangleBuffer_t local_258;
  double local_238;
  filebuf local_230 [24];
  byte abStack_218 [216];
  ios_base local_140 [272];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"usage : ",8);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b138);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," filename.",10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    return 1;
  }
  local_278 = (uint32_t *)0x0;
  iStack_270._M_current = (uint *)0x0;
  local_268 = (uint *)0x0;
  local_288 = (vector_t *)0x0;
  local_298 = (vertex_t *)0x0;
  iStack_290._M_current = (vertex_t *)0x0;
  std::ifstream::ifstream(&local_238,argv[1],_S_in);
  if ((abStack_218[*(long *)((long)local_238 + -0x18)] & 5) == 0) {
    std::istream::_M_extract<unsigned_int>((uint *)&local_238);
    if (local_29c != 0) {
      uVar8 = 0;
      do {
        std::istream::_M_extract<unsigned_int>((uint *)&local_238);
        if (iStack_270._M_current == local_268) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,iStack_270,
                     &local_2a0);
        }
        else {
          *iStack_270._M_current = local_2a0;
          iStack_270._M_current = iStack_270._M_current + 1;
        }
        if (local_2a0 != 0) {
          uVar10 = 0;
          do {
            piVar4 = std::istream::_M_extract<double>(&local_238);
            std::istream::_M_extract<double>((double *)piVar4);
            if (iStack_290._M_current == local_288) {
              std::vector<vector_t,std::allocator<vector_t>>::_M_realloc_insert<vector_t_const&>
                        ((vector<vector_t,std::allocator<vector_t>> *)&local_298,iStack_290,
                         (vector_t *)&local_258);
            }
            else {
              (iStack_290._M_current)->x =
                   (double)local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              (iStack_290._M_current)->y =
                   (double)local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
              iStack_290._M_current = iStack_290._M_current + 1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_2a0);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_29c);
      std::ifstream::~ifstream(&local_238);
      local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PolygonTriangulation::Triangulate
                ((long)iStack_270._M_current - (long)local_278 >> 2,local_278,local_298,&local_258);
      std::ofstream::ofstream
                (&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/tools/js/data.js"
                 ,_S_out);
      if ((abStack_218[*(long *)((long)local_238 + -0x18)] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error : cannot locate the file \"",0x20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/tcoppex[P]polytri/tools/js/data.js"
                   ,0x54);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        exit(1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"var TRI = [",0xb);
      std::ios::widen((char)(ostream *)&local_238 + (char)*(undefined8 *)((long)local_238 + -0x18));
      std::ostream::put((char)&local_238);
      std::ostream::flush();
      ptVar2 = local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ptVar7 = local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"   [ ",5);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"],",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          ptVar7 = ptVar7 + 1;
        } while (ptVar7 != ptVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"];",2);
      std::ios::widen((char)(ostream *)&local_238 + (char)*(undefined8 *)((long)local_238 + -0x18));
      std::ostream::put((char)&local_238);
      std::ostream::flush();
      std::ios::widen((char)&local_238 + (char)*(undefined8 *)((long)local_238 + -0x18));
      std::ostream::put((char)&local_238);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"var vertices = [",0x10);
      std::ios::widen((char)(ostream *)&local_238 + (char)*(undefined8 *)((long)local_238 + -0x18));
      std::ostream::put((char)&local_238);
      std::ostream::flush();
      if (iStack_290._M_current != local_298) {
        uVar8 = 1;
        uVar9 = 0;
        do {
          pvVar1 = local_298;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"   new TPoint( ",0xf);
          poVar5 = std::ostream::_M_insert<double>(pvVar1[uVar9].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = std::ostream::_M_insert<double>(pvVar1[uVar9].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"),",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          uVar9 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar9 < (ulong)((long)iStack_290._M_current - (long)local_298 >> 4));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"];",2);
      std::ios::widen((char)(ostream *)&local_238 + (char)*(undefined8 *)((long)local_238 + -0x18));
      std::ostream::put((char)&local_238);
      std::ostream::flush();
      local_238 = _VTT;
      *(undefined8 *)(local_230 + *(long *)((long)_VTT + -0x18) + -8) = ___cxa_atexit;
      std::filebuf::~filebuf(local_230);
      std::ios_base::~ios_base(local_140);
      if (local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar6 = 0;
      goto LAB_00102a47;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid contour count : ",0x18);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error : can\'t read the file.",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  std::ifstream::~ifstream(&local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error while reading the data file.",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  iVar6 = 1;
  std::ostream::flush();
LAB_00102a47:
  if (local_298 != (vertex_t *)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  if (local_278 != (uint32_t *)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
  return iVar6;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 2) {
    std::cerr << "usage : " << argv[0] << " filename." << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<uint32_t> contour_lengths;
  std::vector<vertex_t> vertices;
  if (LoadSegments(argv[1u], contour_lengths, vertices)) {
    std::cerr << "error while reading the data file." << std::endl;
    return EXIT_FAILURE;
  }

  PolygonTriangulation::TriangleBuffer_t triangles;
  PolygonTriangulation::Triangulate(
    contour_lengths.size(),
    contour_lengths.data(),
    vertices.data(),
    triangles
  );

  ExportData(triangles, vertices);

  return EXIT_SUCCESS;
}